

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O1

string * __thiscall
OpenMPInReductionClause::toString_abi_cxx11_
          (string *__return_storage_ptr__,OpenMPInReductionClause *this)

{
  pointer pcVar1;
  string clause_string;
  string local_68;
  long *local_48;
  ulong local_40;
  long local_38 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"in_reduction ","");
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"(","");
  switch(this->identifier) {
  case OMPC_IN_REDUCTION_IDENTIFIER_plus:
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_minus:
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_mul:
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_bitand:
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_bitor:
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_bitxor:
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_logand:
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_logor:
    break;
  default:
    goto switchD_0017a7f5_caseD_8;
  case OMPC_IN_REDUCTION_IDENTIFIER_max:
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_min:
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_user:
    pcVar1 = (this->user_defined_identifier)._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar1,pcVar1 + (this->user_defined_identifier)._M_string_length)
    ;
    std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_68._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    goto switchD_0017a7f5_caseD_8;
  }
  std::__cxx11::string::append((char *)&local_48);
switchD_0017a7f5_caseD_8:
  if (1 < local_40) {
    std::__cxx11::string::append((char *)&local_48);
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_68,&this->super_OpenMPClause);
  std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_68._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_48);
  if (3 < local_40) {
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPInReductionClause::toString() {

    std::string result = "in_reduction ";
    std::string clause_string = "(";
    OpenMPInReductionClauseIdentifier identifier = this->getIdentifier();
    switch (identifier) {
        case OMPC_IN_REDUCTION_IDENTIFIER_plus:
            clause_string += "+";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_minus:
            clause_string += "-";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_mul:
            clause_string += "*";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_bitand:
            clause_string += "&";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_bitor:
            clause_string += "|";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_bitxor:
            clause_string += "^";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_logand:
            clause_string += "&&";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_logor:
            clause_string += "||";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_min:
            clause_string += "min";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_max:
            clause_string += "max";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_user:
            clause_string += this->getUserDefinedIdentifier();
            break;
        default:
            ;
    }
    if (clause_string.size() > 1) {
        clause_string += " : ";
    };
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };

    return result;
}